

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRet.c
# Opt level: O1

int Rtm_ObjGetDegreeFwd(Rtm_Obj_t *pObj)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar3 = *(uint *)&pObj->field_0x8 >> 7 & 0xff;
  if (uVar3 != 0) {
    uVar4 = 0;
    uVar1 = 0;
    do {
      uVar2 = *(uint *)(*(long *)((long)&pObj[1].pCopy + uVar4) + 8) >> 0xf;
      if (uVar2 < uVar1) {
        uVar2 = uVar1;
      }
      uVar1 = uVar2;
      uVar4 = uVar4 + 0x10;
    } while (uVar3 << 4 != uVar4);
    return uVar1 + 1;
  }
  return 1;
}

Assistant:

int Rtm_ObjGetDegreeFwd( Rtm_Obj_t * pObj )
{
    Rtm_Obj_t * pFanin;
    int i, Degree = 0;
    Rtm_ObjForEachFanin( pObj, pFanin, i )
        Degree = Abc_MaxInt( Degree, (int)pFanin->Num );
    return Degree + 1;
}